

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QGraphicsItemAnimationPrivate::Pair>::end(QList<QGraphicsItemAnimationPrivate::Pair> *this)

{
  Pair *n;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62b89);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::operator->(in_RDI);
  n = QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }